

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_0::ValidateOperandLexicalScope
          (ValidationState_t *_,string *debug_inst_name,Instruction *inst,uint32_t word_index,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
          *ext_inst_name)

{
  bool bVar1;
  DiagnosticStream *pDVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  DiagnosticStream local_238;
  undefined4 local_60;
  anon_class_1_0_00000001 local_59;
  undefined1 local_58 [8];
  function<bool_(CommonDebugInfoInstructions)> expectation;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  *ext_inst_name_local;
  uint32_t word_index_local;
  Instruction *inst_local;
  string *debug_inst_name_local;
  ValidationState_t *__local;
  
  expectation._M_invoker = (_Invoker_type)ext_inst_name;
  std::function<bool(CommonDebugInfoInstructions)>::
  function<spvtools::val::(anonymous_namespace)::ValidateOperandLexicalScope(spvtools::val::ValidationState_t&,std::__cxx11::string_const&,spvtools::val::Instruction_const*,unsigned_int,std::function<std::__cxx11::string()>const&)::__0,void>
            ((function<bool(CommonDebugInfoInstructions)> *)local_58,&local_59);
  bVar1 = DoesDebugInfoOperandMatchExpectation
                    (_,(function<bool_(CommonDebugInfoInstructions)> *)local_58,inst,word_index);
  if (bVar1) {
    __local._4_4_ = SPV_SUCCESS;
  }
  else {
    ValidationState_t::diag(&local_238,_,SPV_ERROR_INVALID_DATA,inst);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    operator()(&local_258,
               (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)expectation._M_invoker);
    pDVar2 = DiagnosticStream::operator<<(&local_238,&local_258);
    pDVar2 = DiagnosticStream::operator<<(pDVar2,(char (*) [3])0x68bfe4);
    pDVar2 = DiagnosticStream::operator<<(pDVar2,(char (*) [18])0x63b174);
    pDVar2 = DiagnosticStream::operator<<(pDVar2,debug_inst_name);
    pDVar2 = DiagnosticStream::operator<<
                       (pDVar2,(char (*) [40])" must be a result id of a lexical scope");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar2);
    std::__cxx11::string::~string((string *)&local_258);
    DiagnosticStream::~DiagnosticStream(&local_238);
  }
  local_60 = 1;
  std::function<bool_(CommonDebugInfoInstructions)>::~function
            ((function<bool_(CommonDebugInfoInstructions)> *)local_58);
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateOperandLexicalScope(
    ValidationState_t& _, const std::string& debug_inst_name,
    const Instruction* inst, uint32_t word_index,
    const std::function<std::string()>& ext_inst_name) {
  std::function<bool(CommonDebugInfoInstructions)> expectation =
      [](CommonDebugInfoInstructions dbg_inst) {
        return dbg_inst == CommonDebugInfoDebugCompilationUnit ||
               dbg_inst == CommonDebugInfoDebugFunction ||
               dbg_inst == CommonDebugInfoDebugLexicalBlock ||
               dbg_inst == CommonDebugInfoDebugTypeComposite;
      };
  if (DoesDebugInfoOperandMatchExpectation(_, expectation, inst, word_index))
    return SPV_SUCCESS;

  return _.diag(SPV_ERROR_INVALID_DATA, inst)
         << ext_inst_name() << ": "
         << "expected operand " << debug_inst_name
         << " must be a result id of a lexical scope";
}